

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.h
# Opt level: O2

IMAGE_DEBUG_DIRECTORY * __thiscall DebugDirWrapper::getDebugDir(DebugDirWrapper *this,size_t index)

{
  Executable *pEVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  if (oVar3 + 1 < 2) {
    return (IMAGE_DEBUG_DIRECTORY *)0x0;
  }
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  UNRECOVERED_JUMPTABLE = (pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar1,oVar3 + index * 0x1c,2,0x1c,0,UNRECOVERED_JUMPTABLE);
  return (IMAGE_DEBUG_DIRECTORY *)CONCAT44(extraout_var,iVar2);
}

Assistant:

IMAGE_DEBUG_DIRECTORY* getDebugDir(size_t index = 0)
    {
        const offset_t rva = getDirEntryAddress();
        if (rva == INVALID_ADDR || rva == 0) {
            return NULL;
        }
        const size_t offset = index * sizeof(IMAGE_DEBUG_DIRECTORY);
        return (IMAGE_DEBUG_DIRECTORY*) m_Exe->getContentAt((rva + offset), Executable::RVA, sizeof(IMAGE_DEBUG_DIRECTORY));
    }